

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O2

void __thiscall DBot::Dofire(DBot *this,ticcmd_t *cmd)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  DObject *pDVar2;
  uint uVar3;
  AWeapon *pAVar4;
  APlayerPawn *pAVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  AActor *pAVar10;
  AActor *pAVar11;
  player_t *ppVar12;
  DAngle *vangle;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 local_78 [48];
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  obj = &this->enemy;
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar10 == (AActor *)0x0) {
    return;
  }
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (((pAVar10->flags).Value & 4) == 0) {
    return;
  }
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar10->health < 1) {
    return;
  }
  pAVar4 = this->player->ReadyWeapon;
  if (pAVar4 == (AWeapon *)0x0) {
    return;
  }
  if ((this->skill).isp < this->player->damagecount) {
    this->first_shot = true;
    return;
  }
  if ((this->first_shot == true) &&
     (-1 < *(int *)&(pAVar4->super_AStateProvider).super_AInventory.field_0x4fc)) {
    iVar9 = (this->skill).reaction;
    iVar8 = FRandom::operator()(&pr_botdofire);
    this->t_react = (0x65 - iVar9) / (iVar8 % 3 + 3);
  }
  this->first_shot = false;
  if (this->t_react != 0) {
    return;
  }
  pAVar5 = this->player->mo;
  pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar14 = (this->player->mo->super_AActor).Vel.X;
  pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar1 = (pAVar11->Vel).X;
  dVar15 = (this->player->mo->super_AActor).Vel.Y;
  pAVar11 = GC::ReadBarrier<AActor>((AActor **)obj);
  dVar14 = AActor::Distance2D(&pAVar5->super_AActor,pAVar10,dVar14 - dVar1,dVar15 - (pAVar11->Vel).Y
                              ,false);
  ppVar12 = this->player;
  pAVar4 = ppVar12->ReadyWeapon;
  uVar3 = *(uint *)&(pAVar4->super_AStateProvider).super_AInventory.field_0x4fc;
  if ((short)uVar3 < 0) {
    if (pAVar4->ProjectileType == (PClassActor *)0x0) {
      if (256.0 < dVar14) {
        return;
      }
      goto LAB_00368abb;
    }
    bVar7 = AWeapon::CheckAmmo(pAVar4,0,false,true,-1);
    if (!bVar7) {
      return;
    }
    ppVar12 = this->player;
    goto LAB_003687e8;
  }
  if ((uVar3 >> 0x1c & 1) == 0) {
    if (pAVar4->ProjectileType == (PClassActor *)0x0) {
      pAVar5 = ppVar12->mo;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      iVar9 = 0;
      AActor::AngleTo((AActor *)local_78,&pAVar5->super_AActor,SUB81(pAVar10,0));
      (this->Angle).Degrees = (double)local_78._0_8_;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (((pAVar10->flags).Value & 0x40000) != 0) {
        iVar9 = FRandom::operator()(&pr_botdofire);
        iVar9 = iVar9 % 0x19 + 10;
      }
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar10->Sector->lightlevel < 0x32) {
        iVar8 = FRandom::operator()(&pr_botdofire);
        iVar9 = iVar9 + iVar8 % 0x28;
      }
      ppVar12 = this->player;
      iVar8 = (this->skill).aiming - (iVar9 + ppVar12->damagecount);
      iVar9 = 1;
      if (1 < iVar8) {
        iVar9 = iVar8;
      }
      dVar14 = ((double)iVar9 * -60.0) / 200.0 + 30.0;
      uVar13 = -(ulong)(0.0 < dVar14);
      dVar14 = (double)(~uVar13 & 0x3ff0000000000000 | (ulong)dVar14 & uVar13);
      bVar7 = this->increase;
      if (bVar7 == false) {
        dVar14 = -dVar14;
      }
      dVar14 = dVar14 + (this->Angle).Degrees;
      (this->Angle).Degrees = dVar14;
      if (ABS((double)SUB84((dVar14 - (ppVar12->mo->super_AActor).Angles.Yaw.Degrees) *
                            11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08) <
          4.0) {
        this->increase = (bool)(bVar7 ^ 1);
      }
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar14 = 30.0;
      vangle = &local_48;
      goto LAB_00368aa5;
    }
    if ((uVar3 >> 0x1e & 1) == 0) {
LAB_003687e8:
      bVar6 = false;
    }
    else {
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      FireRox((DBot *)local_78,(AActor *)this,(ticcmd_t *)pAVar10);
      ppVar12 = this->player;
      if ((((double)local_78._0_8_ == 0.0) && (!NAN((double)local_78._0_8_))) ||
         ((this->Angle).Degrees = (double)local_78._0_8_,
         12.0 <= ABS((double)SUB84(((double)local_78._0_8_ -
                                   (ppVar12->mo->super_AActor).Angles.Yaw.Degrees) *
                                   11930464.711111112 + 6755399441055744.0,0) *
                     8.381903171539307e-08))) goto LAB_003687e8;
      this->t_rocket = 9;
      bVar6 = true;
    }
    pAVar5 = ppVar12->mo;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    local_78._32_8_ = AActor::Distance2D(&pAVar5->super_AActor,pAVar10,false);
    local_78._32_8_ =
         (double)local_78._32_8_ /
         *(double *)((this->player->ReadyWeapon->ProjectileType->super_PClass).Defaults + 0xe0);
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    pDVar2 = (DObject *)(pAVar10->__Pos).Z;
    dVar14 = (pAVar10->__Pos).X;
    dVar1 = (pAVar10->__Pos).Y;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    dVar15 = (double)local_78._32_8_ * (pAVar10->Vel).X;
    dVar16 = (double)local_78._32_8_ * (pAVar10->Vel).Y;
    local_78._0_8_ = dVar15 + dVar15 + dVar14;
    local_78._8_8_ = dVar16 + dVar16 + dVar1;
    local_78._16_8_ = pDVar2;
    FCajunMaster::SetBodyAt(&bglobal,(DVector3 *)local_78,1);
    pAVar5 = this->player->mo;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)&bglobal.body1);
    AActor::AngleTo((AActor *)local_78,&pAVar5->super_AActor,SUB81(pAVar10,0));
    (this->Angle).Degrees = (double)local_78._0_8_;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    local_40.Degrees = 60.0;
    bVar7 = Check_LOS(this,pAVar10,&local_40);
    if (bVar6) goto LAB_00368abb;
  }
  else {
    iVar9 = FRandom::operator()(&pr_botdofire);
    if ((this->skill).reaction < iVar9 % 200) {
      return;
    }
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    dVar14 = 60.0;
    vangle = &local_38;
LAB_00368aa5:
    vangle->Degrees = dVar14;
    bVar7 = Check_LOS(this,pAVar10,vangle);
  }
  if (bVar7 == false) {
    return;
  }
LAB_00368abb:
  *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 1;
  return;
}

Assistant:

void DBot::Dofire (ticcmd_t *cmd)
{
	bool no_fire; //used to prevent bot from pumping rockets into nearby walls.
	int aiming_penalty=0; //For shooting at shading target, if screen is red, MAKEME: When screen red.
	int aiming_value; //The final aiming value.
	double Dist;
	DAngle an;
	DAngle m;
	double fm;

	if (!enemy || !(enemy->flags & MF_SHOOTABLE) || enemy->health <= 0)
		return;

	if (player->ReadyWeapon == NULL)
		return;

	if (player->damagecount > skill.isp)
	{
		first_shot = true;
		return;
	}

	//Reaction skill thing.
	if (first_shot &&
		!(player->ReadyWeapon->WeaponFlags & WIF_BOT_REACTION_SKILL_THING))
	{
		t_react = (100-skill.reaction+1)/((pr_botdofire()%3)+3);
	}
	first_shot = false;
	if (t_react)
		return;

	//MAKEME: Decrease the rocket suicides even more.

	no_fire = true;
	//Distance to enemy.
	Dist = player->mo->Distance2D(enemy, player->mo->Vel.X - enemy->Vel.X, player->mo->Vel.Y - enemy->Vel.Y);

	//FIRE EACH TYPE OF WEAPON DIFFERENT: Here should all the different weapons go.
	if (player->ReadyWeapon->WeaponFlags & WIF_MELEEWEAPON)
	{
		if ((player->ReadyWeapon->ProjectileType != NULL))
		{
			if (player->ReadyWeapon->CheckAmmo (AWeapon::PrimaryFire, false, true))
			{
				// This weapon can fire a projectile and has enough ammo to do so
				goto shootmissile;
			}
			else if (!(player->ReadyWeapon->WeaponFlags & WIF_AMMO_OPTIONAL))
			{
				// Ammo is required, so don't shoot. This is for weapons that shoot
				// missiles that die at close range, such as the powered-up Phoneix Rod.
				return;
			}
		}
		else
		{
			//*4 is for atmosphere,  the chainsaws sounding and all..
			no_fire = (Dist > DEFMELEERANGE*4);
		}
	}
	else if (player->ReadyWeapon->WeaponFlags & WIF_BOT_BFG)
	{
		//MAKEME: This should be smarter.
		if ((pr_botdofire()%200)<=skill.reaction)
			if(Check_LOS(enemy, SHOOTFOV))
				no_fire = false;
	}
	else if (player->ReadyWeapon->ProjectileType != NULL)
	{
		if (player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE)
		{
			//Special rules for RL
			an = FireRox (enemy, cmd);
			if(an != 0)
			{
				Angle = an;
				//have to be somewhat precise. to avoid suicide.
				if (absangle(an, player->mo->Angles.Yaw) < 12.)
				{
					t_rocket = 9;
					no_fire = false;
				}
			}
		}
		// prediction aiming
shootmissile:
		Dist = player->mo->Distance2D(enemy);
		fm = Dist / GetDefaultByType (player->ReadyWeapon->ProjectileType)->Speed;
		bglobal.SetBodyAt(enemy->Pos() + enemy->Vel.XY() * fm * 2, 1);
		Angle = player->mo->AngleTo(bglobal.body1);
		if (Check_LOS (enemy, SHOOTFOV))
			no_fire = false;
	}
	else
	{
		//Other weapons, mostly instant hit stuff.
		Angle = player->mo->AngleTo(enemy);
		aiming_penalty = 0;
		if (enemy->flags & MF_SHADOW)
			aiming_penalty += (pr_botdofire()%25)+10;
		if (enemy->Sector->lightlevel<WHATS_DARK/* && !(player->powers & PW_INFRARED)*/)
			aiming_penalty += pr_botdofire()%40;//Dark
		if (player->damagecount)
			aiming_penalty += player->damagecount; //Blood in face makes it hard to aim
		aiming_value = skill.aiming - aiming_penalty;
		if (aiming_value <= 0)
			aiming_value = 1;
		m = ((SHOOTFOV/2)-(aiming_value*SHOOTFOV/200)); //Higher skill is more accurate
		if (m <= 0)
			m = 1.; //Prevents lock.

		if (m != 0)
		{
			if (increase)
				Angle += m;
			else
				Angle -= m;
		}

		if (absangle(Angle, player->mo->Angles.Yaw) < 4.)
		{
			increase = !increase;
		}

		if (Check_LOS (enemy, (SHOOTFOV/2)))
			no_fire = false;
	}
	if (!no_fire) //If going to fire weapon
	{
		cmd->ucmd.buttons |= BT_ATTACK;
	}
	//Prevents bot from jerking, when firing automatic things with low skill.
}